

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

void __thiscall
soplex::SPxScaler<double>::applyScaling(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  double dVar9;
  
  if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    lVar7 = 0;
    do {
      pIVar4 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar2 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar7].idx;
      iVar3 = (lp->super_LPRowSetBase<double>).scaleExp.data[lVar7];
      if (0 < pIVar4[iVar2].data.super_SVectorBase<double>.memused) {
        pIVar4 = pIVar4 + iVar2;
        pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
        lVar6 = 0;
        lVar8 = 0;
        do {
          dVar9 = ldexp(*(double *)((long)&pNVar5->val + lVar6),
                        (lp->super_LPColSetBase<double>).scaleExp.data
                        [*(int *)((long)&pNVar5->idx + lVar6)] + iVar3);
          pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
          *(double *)((long)&pNVar5->val + lVar6) = dVar9;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar8 < (pIVar4->data).super_SVectorBase<double>.memused);
      }
      dVar9 = ldexp((lp->super_LPRowSetBase<double>).object.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7],iVar3);
      (lp->super_LPRowSetBase<double>).object.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar7] = dVar9;
      dVar9 = (lp->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7];
      ::soplex::infinity::__tls_init();
      if (dVar9 < dVar1) {
        dVar9 = ldexp((lp->super_LPRowSetBase<double>).right.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7],iVar3);
        (lp->super_LPRowSetBase<double>).right.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = dVar9;
      }
      dVar9 = (lp->super_LPRowSetBase<double>).left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7];
      ::soplex::infinity::__tls_init();
      if (-dVar1 < dVar9) {
        dVar9 = ldexp((lp->super_LPRowSetBase<double>).left.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7],iVar3);
        (lp->super_LPRowSetBase<double>).left.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = dVar9;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    lVar7 = 0;
    do {
      pIVar4 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar2 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar7].idx;
      iVar3 = (lp->super_LPColSetBase<double>).scaleExp.data[lVar7];
      if (0 < pIVar4[iVar2].data.super_SVectorBase<double>.memused) {
        pIVar4 = pIVar4 + iVar2;
        pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
        lVar6 = 0;
        lVar8 = 0;
        do {
          dVar9 = ldexp(*(double *)((long)&pNVar5->val + lVar6),
                        (lp->super_LPRowSetBase<double>).scaleExp.data
                        [*(int *)((long)&pNVar5->idx + lVar6)] + iVar3);
          pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
          *(double *)((long)&pNVar5->val + lVar6) = dVar9;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar8 < (pIVar4->data).super_SVectorBase<double>.memused);
      }
      dVar9 = ldexp((lp->super_LPColSetBase<double>).object.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7],iVar3);
      (lp->super_LPColSetBase<double>).object.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar7] = dVar9;
      dVar9 = (lp->super_LPColSetBase<double>).up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7];
      ::soplex::infinity::__tls_init();
      if (dVar9 < dVar1) {
        dVar9 = ldexp((lp->super_LPColSetBase<double>).up.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7],-iVar3);
        (lp->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar7] = dVar9;
      }
      dVar9 = (lp->super_LPColSetBase<double>).low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7];
      ::soplex::infinity::__tls_init();
      if (-dVar1 < dVar9) {
        dVar9 = ldexp((lp->super_LPColSetBase<double>).low.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7],-iVar3);
        (lp->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar7] = dVar9;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  lp->_isScaled = true;
  return;
}

Assistant:

void SPxScaler<R>::applyScaling(SPxLPBase<R>& lp)
{
   assert(lp.nCols() == m_activeColscaleExp->size());
   assert(lp.nRows() == m_activeRowscaleExp->size());

   DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);
      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), exp2);

      SPxOut::debug(this, "DEBUG: rowscaleExp({}): {}\n", i, exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);
      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), -exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), -exp2);

      SPxOut::debug(this, "DEBUG: colscaleExp({}): {}\n", i, exp2);
   }

   lp.setScalingInfo(true);
   assert(lp.isConsistent());
}